

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O3

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  GLsizei GVar2;
  ImDrawList *pIVar3;
  ImDrawCmd *pIVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  GLvoid *pGVar7;
  GLboolean GVar8;
  GLboolean GVar9;
  GLboolean GVar10;
  GLboolean GVar11;
  GLboolean GVar12;
  GLboolean GVar13;
  undefined4 in_EAX;
  int iVar14;
  uint uVar15;
  PFNGLENABLEPROC *pp_Var16;
  long lVar17;
  PFNGLENABLEPROC *pp_Var18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  GLuint vertex_array_object;
  GLuint last_sampler;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLuint last_vertex_array_object;
  GLuint last_array_buffer;
  GLuint last_texture;
  GLuint last_program;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLuint local_e8;
  GLuint local_e4;
  PFNGLDISABLEPROC *local_e0;
  float local_d8;
  GLenum local_d4;
  GLenum local_d0;
  GLenum local_cc;
  GLenum local_c8;
  GLenum local_c4;
  GLenum local_c0;
  GLuint local_bc;
  GLuint local_b8;
  GLuint local_b4;
  GLuint local_b0;
  GLenum local_ac;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  GLint local_98;
  GLint local_94;
  GLsizei local_90;
  GLsizei local_8c;
  GLint local_88;
  GLint local_84;
  GLsizei local_80;
  GLsizei local_7c;
  GLenum local_70 [2];
  ImVec2 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar25 = (float)(int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fVar27 = (float)(int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar23._0_4_ = -(uint)(0 < (int)fVar25);
  auVar23._4_4_ = -(uint)(0 < (int)fVar25);
  auVar23._8_4_ = -(uint)(0 < (int)fVar27);
  auVar23._12_4_ = -(uint)(0 < (int)fVar27);
  iVar14 = movmskpd(in_EAX,auVar23);
  if (iVar14 == 3) {
    local_a8.y = fVar27;
    local_a8.x = fVar25;
    uStack_a0 = 0;
    (*gl3wGetIntegerv)(0x84e0,(GLint *)&local_ac);
    (*gl3wActiveTexture)(0x84c0);
    (*gl3wGetIntegerv)(0x8b8d,(GLint *)&local_b0);
    (*gl3wGetIntegerv)(0x8069,(GLint *)&local_b4);
    if (g_GlVersion < 0x14a) {
      local_e4 = 0;
    }
    else {
      (*gl3wGetIntegerv)(0x8919,(GLint *)&local_e4);
    }
    (*gl3wGetIntegerv)(0x8894,(GLint *)&local_b8);
    (*gl3wGetIntegerv)(0x85b5,(GLint *)&local_bc);
    (*gl3wGetIntegerv)(0xb40,(GLint *)local_70);
    (*gl3wGetIntegerv)(0xba2,&local_88);
    (*gl3wGetIntegerv)(0xc10,&local_98);
    (*gl3wGetIntegerv)(0x80c9,(GLint *)&local_c0);
    (*gl3wGetIntegerv)(0x80c8,(GLint *)&local_c4);
    (*gl3wGetIntegerv)(0x80cb,(GLint *)&local_c8);
    (*gl3wGetIntegerv)(0x80ca,(GLint *)&local_cc);
    (*gl3wGetIntegerv)(0x8009,(GLint *)&local_d0);
    (*gl3wGetIntegerv)(0x883d,(GLint *)&local_d4);
    GVar8 = (*gl3wIsEnabled)(0xbe2);
    GVar9 = (*gl3wIsEnabled)(0xb44);
    GVar10 = (*gl3wIsEnabled)(0xb71);
    GVar11 = (*gl3wIsEnabled)(0xb90);
    GVar12 = (*gl3wIsEnabled)(0xc11);
    if ((g_GlVersion < 0x136) || (GVar13 = (*gl3wIsEnabled)(0x8f9d), GVar13 == '\0')) {
      local_e0 = &gl3wDisable;
    }
    else {
      local_e0 = &gl3wEnable;
    }
    local_e8 = 0;
    (*gl3wGenVertexArrays)(1,&local_e8);
    fVar25 = local_a8.x;
    fVar27 = local_a8.y;
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)local_a8.x,(int)local_a8.y,local_e8);
    if (0 < draw_data->CmdListsCount) {
      local_d8 = (float)(int)fVar25;
      fVar21 = (float)(int)fVar27;
      local_a8 = draw_data->DisplayPos;
      local_68 = draw_data->FramebufferScale;
      local_48 = local_68.y;
      uStack_60 = 0;
      uStack_a0 = 0;
      local_58 = local_a8.y;
      lVar20 = 0;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      do {
        pIVar3 = draw_data->CmdLists[lVar20];
        (*gl3wBufferData)(0x8892,(long)(pIVar3->VtxBuffer).Size * 0x14,(pIVar3->VtxBuffer).Data,
                          0x88e0);
        (*gl3wBufferData)(0x8893,(long)(pIVar3->IdxBuffer).Size * 2,(pIVar3->IdxBuffer).Data,0x88e0)
        ;
        if (0 < (pIVar3->CmdBuffer).Size) {
          lVar17 = 0;
          lVar19 = 0;
          do {
            pIVar4 = (pIVar3->CmdBuffer).Data;
            pcVar5 = *(code **)((long)&pIVar4->UserCallback + lVar17);
            if (pcVar5 == (code *)0x0) {
              fVar22 = (*(float *)((long)&(pIVar4->ClipRect).x + lVar17) - local_a8.x) * local_68.x;
              if ((fVar22 < local_d8) &&
                 (fVar24 = (*(float *)((long)&(pIVar4->ClipRect).y + lVar17) - local_58) * local_48,
                 fVar24 < fVar21)) {
                uVar1 = *(undefined8 *)((long)&(pIVar4->ClipRect).z + lVar17);
                fVar26 = ((float)uVar1 - local_a8.x) * local_68.x;
                fVar28 = ((float)((ulong)uVar1 >> 0x20) - local_a8.y) * local_68.y;
                iVar14 = -(uint)(0.0 <= fVar26);
                auVar6._4_4_ = iVar14;
                auVar6._0_4_ = iVar14;
                auVar6._8_4_ = -(uint)(0.0 <= fVar28);
                auVar6._12_4_ = -(uint)(0.0 <= fVar28);
                uVar15 = movmskpd(0,auVar6);
                if (((uVar15 & 1) != 0) && ((byte)((byte)uVar15 >> 1) != 0)) {
                  (*gl3wScissor)((int)fVar22,(int)(fVar21 - fVar28),(int)(fVar26 - fVar22),
                                 (int)(fVar28 - fVar24));
                  (*gl3wBindTexture)(0xde1,*(GLuint *)((long)&pIVar4->TextureId + lVar17));
                  GVar2 = *(GLsizei *)((long)&pIVar4->ElemCount + lVar17);
                  pGVar7 = (GLvoid *)((ulong)*(uint *)((long)&pIVar4->IdxOffset + lVar17) * 2);
                  if (g_GlVersion < 0x140) {
                    (*gl3wDrawElements)(4,GVar2,0x1403,pGVar7);
                  }
                  else {
                    (*gl3wDrawElementsBaseVertex)
                              (4,GVar2,0x1403,pGVar7,*(GLint *)((long)&pIVar4->VtxOffset + lVar17));
                  }
                }
              }
            }
            else if (pcVar5 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)fVar25,(int)fVar27,local_e8);
            }
            else {
              (*pcVar5)(pIVar3,(long)&(pIVar4->ClipRect).x + lVar17);
            }
            lVar19 = lVar19 + 1;
            lVar17 = lVar17 + 0x38;
          } while (lVar19 < (pIVar3->CmdBuffer).Size);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < draw_data->CmdListsCount);
    }
    (*gl3wDeleteVertexArrays)(1,&local_e8);
    (*gl3wUseProgram)(local_b0);
    (*gl3wBindTexture)(0xde1,local_b4);
    if (0x149 < g_GlVersion) {
      (*gl3wBindSampler)(0,local_e4);
    }
    (*gl3wActiveTexture)(local_ac);
    (*gl3wBindVertexArray)(local_bc);
    (*gl3wBindBuffer)(0x8892,local_b8);
    (*gl3wBlendEquationSeparate)(local_d0,local_d4);
    (*gl3wBlendFuncSeparate)(local_c0,local_c4,local_c8,local_cc);
    pp_Var18 = &gl3wEnable;
    pp_Var16 = &gl3wEnable;
    if (GVar8 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xbe2);
    pp_Var16 = &gl3wEnable;
    if (GVar9 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xb44);
    pp_Var16 = &gl3wEnable;
    if (GVar10 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xb71);
    pp_Var16 = &gl3wEnable;
    if (GVar11 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xb90);
    if (GVar12 == '\0') {
      pp_Var18 = &gl3wDisable;
    }
    (**pp_Var18)(0xc11);
    if (0x135 < g_GlVersion) {
      (**local_e0)(0x8f9d);
    }
    (*gl3wPolygonMode)(0x408,local_70[0]);
    (*gl3wViewport)(local_88,local_84,local_80,local_7c);
    (*gl3wScissor)(local_98,local_94,local_90,local_8c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLuint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, (GLint*)&last_program);
    GLuint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, (GLint*)&last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    GLuint last_sampler; if (g_GlVersion >= 330) { glGetIntegerv(GL_SAMPLER_BINDING, (GLint*)&last_sampler); } else { last_sampler = 0; }
#endif
    GLuint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, (GLint*)&last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLuint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, (GLint*)&last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_stencil_test = glIsEnabled(GL_STENCIL_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    GLboolean last_enable_primitive_restart = (g_GlVersion >= 310) ? glIsEnabled(GL_PRIMITIVE_RESTART) : GL_FALSE;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * (int)sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * (int)sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 320)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (g_GlVersion >= 330)
        glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_stencil_test) glEnable(GL_STENCIL_TEST); else glDisable(GL_STENCIL_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (g_GlVersion >= 310) { if (last_enable_primitive_restart) glEnable(GL_PRIMITIVE_RESTART); else glDisable(GL_PRIMITIVE_RESTART); }
#endif

#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}